

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O3

void __thiscall
iu_DISABLED_TestFailure_x_iutest_x_Subroutine1_Test::Body
          (iu_DISABLED_TestFailure_x_iutest_x_Subroutine1_Test *this)

{
  iuStreamMessage *piVar1;
  int x;
  ScopedMessage scoped_message_2;
  int n;
  iuCodeMessage local_390;
  ScopedMessage local_360;
  undefined1 local_330 [392];
  undefined1 local_1a8 [392];
  
  n = 100;
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a8);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_330);
  piVar1 = iutest::detail::iuStreamMessage::operator<<
                     ((iuStreamMessage *)local_330,(char (*) [13])"routine1. x=");
  piVar1 = iutest::detail::iuStreamMessage::operator<<(piVar1,(int *)&stack0xfffffffffffffc6c);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,piVar1);
  std::__cxx11::stringbuf::str();
  local_390.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/simple.cpp";
  local_390.m_line = 0x7c;
  iutest::AssertionHelper::ScopedMessage::ScopedMessage(&local_360,&local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.m_message._M_dataplus._M_p != &local_390.m_message.field_2) {
    operator_delete(local_390.m_message._M_dataplus._M_p,
                    local_390.m_message.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_330);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x80));
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  Sub1(n);
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage(&local_360);
  Sub1(n);
  return;
}

Assistant:

IUTEST(DISABLED_TestFailure, Subroutine1)
{
    {
        int x=100;
        IUTEST_SCOPED_TRACE(::iutest::Message() << "routine1. x=" << x);

        Sub1(x);
    }
    // ここの失敗には "routine1." のメッセージは表示されません。
    Sub1(3);
}